

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiGpj.cxx
# Opt level: O2

void GhsMultiGpj::WriteGpjTag(Types gpjType,ostream *fout)

{
  ostream *poVar1;
  char *pcVar2;
  
  if (gpjType < (CUSTOM_TARGET|LIBRARY)) {
    pcVar2 = GHS_TAG[gpjType];
  }
  else {
    pcVar2 = "";
  }
  poVar1 = std::operator<<(fout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void GhsMultiGpj::WriteGpjTag(Types gpjType, std::ostream& fout)
{
  char const* tag;
  tag = GhsMultiGpj::GetGpjTag(gpjType);
  fout << tag << std::endl;
}